

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

int generate_key_from_aid(char *account_id,uint8_t *key)

{
  int iVar1;
  long lVar2;
  long lVar3;
  char byte [3];
  uint8_t aid [8];
  undefined2 local_2c;
  undefined1 local_2a;
  uint8_t local_28 [8];
  
  lVar3 = 0;
  while( true ) {
    local_2c = *(undefined2 *)(account_id + lVar3 * 2);
    local_2a = 0;
    lVar2 = strtol((char *)&local_2c,(char **)0x0,0x10);
    local_28[lVar3] = (uint8_t)lVar2;
    if (((uint8_t)lVar2 == '\0') && (((char)local_2c != '0' || (local_2c._1_1_ != '0')))) break;
    lVar3 = lVar3 + 1;
    if (lVar3 == 8) {
      iVar1 = -1;
      if (account_id[0x10] == '\0') {
        cma_keygen(local_28,key);
        iVar1 = 0;
      }
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int generate_key_from_aid(const char *account_id, uint8_t key[0x20]) {
  int i;
  uint8_t aid[8];
  for (i = 0; i < 0x08; i++) {
    char byte[3];
    memcpy(byte, &account_id[2*i], 2);
    byte[2] = '\0';
    aid[i] = strtol(byte, NULL, 16);
    if (aid[i] == 0 && !(byte[0] == '0' && byte[1] == '0')) {
      return -1;
    }
  }
  if (account_id[2*i] != '\0') {
    return -1;
  }
  cma_keygen(aid, key);
  return 0;
}